

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCreateMffc(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,char *pNodeName)

{
  Abc_Aig_t *pMan;
  Abc_Ntk_t *pNtk_00;
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *vCone;
  Vec_Ptr_t *vSupp;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p1;
  long lVar5;
  int iVar6;
  char Buffer [1000];
  
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x439,"Abc_Ntk_t *Abc_NtkCreateMffc(Abc_Ntk_t *, Abc_Obj_t *, char *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
    iVar6 = 0;
    sprintf(Buffer,"%s_%s",pNtk->pName,pNodeName);
    pcVar1 = Extra_UtilStrsav(Buffer);
    pNtk_00->pName = pcVar1;
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      pAVar2 = Abc_AigConst1(pNtk_00);
      pAVar3 = Abc_AigConst1(pNtk);
      (pAVar3->field_6).pCopy = pAVar2;
    }
    vCone = Vec_PtrAlloc(100);
    vSupp = Vec_PtrAlloc(100);
    Abc_NodeDeref_rec(pNode);
    Abc_NodeMffcConeSupp(pNode,vCone,vSupp);
    Abc_NodeRef_rec(pNode);
    for (; iVar6 < vSupp->nSize; iVar6 = iVar6 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vSupp,iVar6);
      pAVar3 = Abc_NtkCreatePi(pNtk_00);
      (pAVar2->field_6).pCopy = pAVar3;
      pcVar1 = Abc_ObjName(pAVar2);
      Abc_ObjAssignName(pAVar3,pcVar1,(char *)0x0);
    }
    pAVar2 = Abc_NtkCreatePo(pNtk_00);
    Abc_ObjAssignName(pAVar2,pNodeName,(char *)0x0);
    for (iVar6 = 0; iVar6 < vCone->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vCone,iVar6);
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
        pAVar4 = Abc_ObjChild0Copy(pAVar3);
        p1 = Abc_ObjChild1Copy(pAVar3);
        pAVar4 = Abc_AigAnd(pMan,pAVar4,p1);
        (pAVar3->field_6).pCopy = pAVar4;
      }
      else {
        Abc_NtkDupObj(pNtk_00,pAVar3,0);
        for (lVar5 = 0; lVar5 < (pAVar3->vFanins).nSize; lVar5 = lVar5 + 1) {
          Abc_ObjAddFanin((pAVar3->field_6).pCopy,
                          *(Abc_Obj_t **)
                           ((long)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar5]] +
                           0x40));
        }
      }
    }
    Abc_ObjAddFanin(pAVar2,(pNode->field_6).pCopy);
    Vec_PtrFree(vCone);
    Vec_PtrFree(vSupp);
    iVar6 = Abc_NtkCheck(pNtk_00);
    if (iVar6 == 0) {
      fwrite("Abc_NtkCreateMffc(): Network check has failed.\n",0x2f,1,_stdout);
    }
    return pNtk_00;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                ,0x43a,"Abc_Ntk_t *Abc_NtkCreateMffc(Abc_Ntk_t *, Abc_Obj_t *, char *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateMffc( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, char * pNodeName )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pNodeCoNew;
    Vec_Ptr_t * vCone, * vSupp;
    char Buffer[1000];
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // set the name
    sprintf( Buffer, "%s_%s", pNtk->pName, pNodeName );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // establish connection between the constant nodes
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // collect the nodes in MFFC
    vCone = Vec_PtrAlloc( 100 );
    vSupp = Vec_PtrAlloc( 100 );
    Abc_NodeDeref_rec( pNode );
    Abc_NodeMffcConeSupp( pNode, vCone, vSupp );
    Abc_NodeRef_rec( pNode );
    // create the PIs
    Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // create the PO
    pNodeCoNew = Abc_NtkCreatePo( pNtkNew );
    Abc_ObjAssignName( pNodeCoNew, pNodeName, NULL );
    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, i )
    {
        // if it is an AIG, add to the hash table
        if ( Abc_NtkIsStrash(pNtk) )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    // connect the topmost node
    Abc_ObjAddFanin( pNodeCoNew, pNode->pCopy );
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSupp );

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateMffc(): Network check has failed.\n" );
    return pNtkNew;
}